

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void copysymbolinfo(MOJOSHADER_symbolTypeInfo *dst,MOJOSHADER_symbolTypeInfo *src,
                   MOJOSHADER_malloc m,void *d)

{
  MOJOSHADER_symbolStructMember *pMVar1;
  size_t sVar2;
  char *__dest;
  char *stringcopy;
  uint32 siz;
  int i;
  void *d_local;
  MOJOSHADER_malloc m_local;
  MOJOSHADER_symbolTypeInfo *src_local;
  MOJOSHADER_symbolTypeInfo *dst_local;
  
  dst->parameter_class = src->parameter_class;
  dst->parameter_type = src->parameter_type;
  dst->rows = src->rows;
  dst->columns = src->columns;
  dst->elements = src->elements;
  dst->member_count = src->member_count;
  if (dst->member_count != 0) {
    pMVar1 = (MOJOSHADER_symbolStructMember *)(*m)(dst->member_count * 0x28,d);
    dst->members = pMVar1;
    for (stringcopy._4_4_ = 0; stringcopy._4_4_ < dst->member_count;
        stringcopy._4_4_ = stringcopy._4_4_ + 1) {
      if (src->members[(int)stringcopy._4_4_].name != (char *)0x0) {
        sVar2 = strlen(src->members[(int)stringcopy._4_4_].name);
        __dest = (char *)(*m)((int)sVar2 + 1,d);
        strcpy(__dest,src->members[(int)stringcopy._4_4_].name);
        dst->members[(int)stringcopy._4_4_].name = __dest;
      }
      copysymbolinfo(&dst->members[(int)stringcopy._4_4_].info,
                     &src->members[(int)stringcopy._4_4_].info,m,d);
    }
  }
  return;
}

Assistant:

void copysymbolinfo(MOJOSHADER_symbolTypeInfo *dst,
                    MOJOSHADER_symbolTypeInfo *src,
                    MOJOSHADER_malloc m,
                    void *d)
{
    int i;
    uint32 siz;
    char *stringcopy;

    dst->parameter_class = src->parameter_class;
    dst->parameter_type = src->parameter_type;
    dst->rows = src->rows;
    dst->columns = src->columns;
    dst->elements = src->elements;
    dst->member_count = src->member_count;

    if (dst->member_count > 0)
    {
        siz = sizeof (MOJOSHADER_symbolStructMember) * dst->member_count;
        dst->members = (MOJOSHADER_symbolStructMember *) m(siz, d);
        // !!! FIXME: Out of memory check!
        for (i = 0; i < dst->member_count; i++)
        {
            if (src->members[i].name != NULL)
            {
                siz = strlen(src->members[i].name) + 1;
                stringcopy = (char *) m(siz, d);
                strcpy(stringcopy, src->members[i].name);
                dst->members[i].name = stringcopy;
            } // if
            copysymbolinfo(&dst->members[i].info, &src->members[i].info, m, d);
        } // for
    } // if
}